

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

void dec_vproc_clr_prev1(MppDecVprocCtxImpl *ctx)

{
  uint uVar1;
  MppFrame pvVar2;
  RK_U32 RVar3;
  MppBuffer pvVar4;
  int local_2c;
  MppBuffer buf_1;
  RK_S32 fd;
  MppBuffer buf;
  MppDecVprocCtxImpl *ctx_local;
  
  if ((vproc_debug & 2) != 0) {
    if (ctx->prev_frm1 == (MppFrame)0x0) {
      _mpp_log_l(4,"mpp_dec_vproc","clearing nothing\n",(char *)0x0);
    }
    else {
      pvVar4 = mpp_frame_get_buffer(ctx->prev_frm1);
      if (pvVar4 == (MppBuffer)0x0) {
        local_2c = -1;
      }
      else {
        local_2c = mpp_buffer_get_fd_with_caller(pvVar4,"dec_vproc_clr_prev1");
      }
      uVar1 = ctx->prev_idx1;
      pvVar2 = ctx->prev_frm1;
      RVar3 = mpp_frame_get_poc(ctx->prev_frm1);
      _mpp_log_l(4,"mpp_dec_vproc","clearing prev index %d frm %p fd %d, poc %d\n",(char *)0x0,
                 (ulong)uVar1,pvVar2,local_2c,RVar3);
    }
  }
  if ((ctx->prev_frm1 != (MppFrame)0x0) &&
     (pvVar4 = mpp_frame_get_buffer(ctx->prev_frm1), pvVar4 != (MppBuffer)0x0)) {
    mpp_buffer_put_with_caller(pvVar4,"dec_vproc_clr_prev1");
  }
  if (-1 < ctx->prev_idx1) {
    mpp_buf_slot_clr_flag(ctx->slots,ctx->prev_idx1,SLOT_QUEUE_USE);
  }
  ctx->prev_idx1 = -1;
  ctx->prev_frm1 = (MppFrame)0x0;
  return;
}

Assistant:

static void dec_vproc_clr_prev1(MppDecVprocCtxImpl *ctx)
{
    if (vproc_debug & VPROC_DBG_STATUS) {
        if (ctx->prev_frm1) {
            MppBuffer buf = mpp_frame_get_buffer(ctx->prev_frm1);
            RK_S32 fd = (buf) ? (mpp_buffer_get_fd(buf)) : (-1);
            mpp_log("clearing prev index %d frm %p fd %d, poc %d\n", ctx->prev_idx1,
                    ctx->prev_frm1, fd, mpp_frame_get_poc(ctx->prev_frm1));
        } else
            mpp_log("clearing nothing\n");
    }
    if (ctx->prev_frm1) {
        MppBuffer buf = mpp_frame_get_buffer(ctx->prev_frm1);
        if (buf)
            mpp_buffer_put(buf);
    }
    if (ctx->prev_idx1 >= 0)
        mpp_buf_slot_clr_flag(ctx->slots, ctx->prev_idx1, SLOT_QUEUE_USE);

    ctx->prev_idx1 = -1;
    ctx->prev_frm1 = NULL;
}